

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.h
# Opt level: O3

char * __thiscall CNscPStackEntry::GetString(CNscPStackEntry *this,size_t *pnLength)

{
  uchar *puVar1;
  
  if (this->m_nType != NscType_String) {
    __assert_fail("m_nType == NscType_String",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x168,"const char *CNscPStackEntry::GetString(size_t *) const");
  }
  if (this->m_nDataSize < 0x20) {
    __assert_fail("m_nDataSize >= sizeof (NscPCodeConstantString)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x169,"const char *CNscPStackEntry::GetString(size_t *) const");
  }
  puVar1 = this->m_pauchData;
  if (*(int *)(puVar1 + 8) != 0x34) {
    __assert_fail("p ->nOpCode == NscPCode_Constant",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x16b,"const char *CNscPStackEntry::GetString(size_t *) const");
  }
  if (*(int *)(puVar1 + 0xc) == 8) {
    if (this->m_nDataSize == *(size_t *)(puVar1 + 0x10) + 0x20) {
      if (pnLength != (size_t *)0x0) {
        *pnLength = *(size_t *)(puVar1 + 0x10);
      }
      return (char *)(puVar1 + 0x18);
    }
    __assert_fail("m_nDataSize == sizeof (NscPCodeConstantString) + p ->nLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x16d,"const char *CNscPStackEntry::GetString(size_t *) const");
  }
  __assert_fail("p ->nType == NscType_String",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0x16c,"const char *CNscPStackEntry::GetString(size_t *) const");
}

Assistant:

const char *GetString (size_t *pnLength = NULL) const
	{
		assert (m_nType == NscType_String);
		assert (m_nDataSize >= sizeof (NscPCodeConstantString));
		NscPCodeConstantString *p = (NscPCodeConstantString *) m_pauchData;
		assert (p ->nOpCode == NscPCode_Constant);
		assert (p ->nType == NscType_String);
		assert (m_nDataSize == sizeof (NscPCodeConstantString) + p ->nLength);
		if (pnLength)
			*pnLength = p ->nLength;
		return p ->szString;
	}